

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CommandLineParser.cpp
# Opt level: O3

bool __thiscall CommandLineParser::argumentStartsWith(CommandLineParser *this,string *expected)

{
  int iVar1;
  bool bVar2;
  long *local_50;
  size_t local_48;
  long local_40 [2];
  string local_30;
  
  getCurrentArgument_abi_cxx11_(&local_30,this);
  std::__cxx11::string::substr((ulong)&local_50,(ulong)&local_30);
  if (local_48 == expected->_M_string_length) {
    if (local_48 == 0) {
      bVar2 = true;
    }
    else {
      iVar1 = bcmp(local_50,(expected->_M_dataplus)._M_p,local_48);
      bVar2 = iVar1 == 0;
    }
  }
  else {
    bVar2 = false;
  }
  if (local_50 != local_40) {
    operator_delete(local_50,local_40[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  return bVar2;
}

Assistant:

bool 
CommandLineParser::argumentStartsWith( const std::string &expected ) const
{
  return getCurrentArgument().substr( 0, expected.length() ) == expected;
}